

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  ImVec2 IVar4;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_fc;
  float local_f8;
  float local_f0;
  int local_dc;
  float avail_h;
  float avail_w;
  ImGuiDir dir_1;
  int n_1;
  ImGuiDir dir_prefered_order [4];
  ImRect local_a0;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImGuiDir local_70;
  int local_6c;
  ImGuiDir dir;
  int n;
  ImGuiDir dir_prefered_order_1 [4];
  float local_44;
  float fStack_40;
  ImVec2 base_pos_clamped;
  ImGuiPopupPositionPolicy policy_local;
  ImRect *r_avoid_local;
  ImRect *r_outer_local;
  ImGuiDir *last_dir_local;
  ImVec2 *size_local;
  ImVec2 *ref_pos_local;
  ImVec2 pos;
  
  IVar4 = operator-(&r_outer->Max,size);
  IVar4 = ImClamp(ref_pos,&r_outer->Min,IVar4);
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    _dir = 0x100000003;
    dir_prefered_order_1[0] = 0;
    dir_prefered_order_1[1] = 2;
    local_6c = 0;
    if (*last_dir != -1) {
      local_6c = -1;
    }
    for (; local_6c < 4; local_6c = local_6c + 1) {
      if (local_6c == -1) {
        local_dc = *last_dir;
      }
      else {
        local_dc = (&dir)[local_6c];
      }
      local_70 = local_dc;
      if ((local_6c == -1) || (local_dc != *last_dir)) {
        ImVec2::ImVec2((ImVec2 *)&ref_pos_local);
        if (local_70 == 3) {
          ImVec2::ImVec2(&local_78,(r_avoid->Min).x,(r_avoid->Max).y);
          ref_pos_local = (ImVec2 *)local_78;
        }
        if (local_70 == 1) {
          ImVec2::ImVec2(&local_80,(r_avoid->Min).x,(r_avoid->Min).y - size->y);
          ref_pos_local = (ImVec2 *)local_80;
        }
        if (local_70 == 0) {
          ImVec2::ImVec2(&local_88,(r_avoid->Max).x - size->x,(r_avoid->Max).y);
          ref_pos_local = (ImVec2 *)local_88;
        }
        if (local_70 == 2) {
          ImVec2::ImVec2(&local_90,(r_avoid->Max).x - size->x,(r_avoid->Min).y - size->y);
          ref_pos_local = (ImVec2 *)local_90;
        }
        dir_prefered_order._8_8_ = operator+((ImVec2 *)&ref_pos_local,size);
        ImRect::ImRect(&local_a0,(ImVec2 *)&ref_pos_local,(ImVec2 *)(dir_prefered_order + 2));
        bVar2 = ImRect::Contains(r_outer,&local_a0);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          *last_dir = local_70;
          return (ImVec2)ref_pos_local;
        }
      }
    }
  }
  _dir_1 = 0x300000001;
  dir_prefered_order[0] = 2;
  dir_prefered_order[1] = 0;
  avail_w = 0.0;
  if (*last_dir != -1) {
    avail_w = -NAN;
  }
  do {
    if (3 < (int)avail_w) {
      *last_dir = -1;
      ref_pos_local = *(ImVec2 **)ref_pos;
      fVar3 = ImMin<float>(ref_pos_local._0_4_ + size->x,(r_outer->Max).x);
      fVar3 = ImMax<float>(fVar3 - size->x,(r_outer->Min).x);
      ref_pos_local = (ImVec2 *)CONCAT44(ref_pos_local._4_4_,fVar3);
      fVar3 = ImMin<float>(ref_pos_local._4_4_ + size->y,(r_outer->Max).y);
      fVar3 = ImMax<float>(fVar3 - size->y,(r_outer->Min).y);
      ref_pos_local = (ImVec2 *)CONCAT44(fVar3,ref_pos_local._0_4_);
      return (ImVec2)ref_pos_local;
    }
    if (avail_w == -NAN) {
      iVar1 = *last_dir;
LAB_001de573:
      if (iVar1 == 0) {
        local_f0 = (r_avoid->Min).x;
      }
      else {
        local_f0 = (r_outer->Max).x;
      }
      if (iVar1 == 1) {
        local_f8 = (r_avoid->Max).x;
      }
      else {
        local_f8 = (r_outer->Min).x;
      }
      if (iVar1 == 2) {
        local_fc = (r_avoid->Min).y;
      }
      else {
        local_fc = (r_outer->Max).y;
      }
      if (iVar1 == 3) {
        local_104 = (r_avoid->Max).y;
      }
      else {
        local_104 = (r_outer->Min).y;
      }
      if ((size->x <= local_f0 - local_f8) && (size->y <= local_fc - local_104)) {
        ImVec2::ImVec2((ImVec2 *)&ref_pos_local);
        if (iVar1 == 0) {
          local_108 = (r_avoid->Min).x - size->x;
        }
        else {
          if (iVar1 == 1) {
            local_10c = (r_avoid->Max).x;
          }
          else {
            local_44 = IVar4.x;
            local_10c = local_44;
          }
          local_108 = local_10c;
        }
        if (iVar1 == 2) {
          local_110 = (r_avoid->Min).y - size->y;
        }
        else {
          if (iVar1 == 3) {
            local_114 = (r_avoid->Max).y;
          }
          else {
            fStack_40 = IVar4.y;
            local_114 = fStack_40;
          }
          local_110 = local_114;
        }
        ref_pos_local = (ImVec2 *)CONCAT44(local_110,local_108);
        *last_dir = iVar1;
        return (ImVec2)ref_pos_local;
      }
    }
    else {
      iVar1 = (&dir_1)[(int)avail_w];
      if (iVar1 != *last_dir) goto LAB_001de573;
    }
    avail_w = (float)((int)avail_w + 1);
  } while( true );
}

Assistant:

static ImVec2 FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy = ImGuiPopupPositionPolicy_Default)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GImGui->OverlayDrawList.AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GImGui->OverlayDrawList.AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Default popup policy
    const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
    for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
    {
        const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
        if (n != -1 && dir == *last_dir) // Already tried this direction?
            continue;
        float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
        float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);
        if (avail_w < size.x || avail_h < size.y)
            continue;
        ImVec2 pos;
        pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
        pos.y = (dir == ImGuiDir_Up)   ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down)  ? r_avoid.Max.y : base_pos_clamped.y;
        *last_dir = dir;
        return pos;
    }

    // Fallback, try to keep within display
    *last_dir = ImGuiDir_None;
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}